

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O2

unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_> __thiscall
jaegertracing::Tracer::StartSpanWithOptions
          (Tracer *this,string_view operationName,StartSpanOptions *options)

{
  element_type *peVar1;
  undefined8 uVar2;
  bool bVar3;
  uint64_t spanID;
  uint64_t uVar4;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  from_time_point;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  from_time_point_00;
  invalid_argument *this_00;
  byte bVar5;
  Tracer *this_01;
  duration *in_R8;
  uchar uVar6;
  undefined1 local_498 [16];
  TraceID traceID;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470 [2];
  SamplingStatus samplingStatus;
  undefined8 auStack_420 [3];
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> samplerTags;
  string_view operationName_local;
  AnalyzedReferences result;
  SpanContext ctx;
  SpanContext local_240;
  SpanContext local_190;
  SpanContext local_e0;
  
  operationName_local.data_ = (char *)operationName.length_;
  this_01 = (Tracer *)operationName.data_;
  local_498._8_8_ = this;
  operationName_local.length_ = (size_t)options;
  analyzeReferences(&result,this_01,
                    (vector<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>
                     *)(in_R8 + 2));
  if ((result._self != (SpanContext *)0x0) &&
     ((result._parent != (SpanContext *)0x0 ||
      (result._references.
       super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
       _M_impl.super__Vector_impl_data._M_start !=
       result._references.
       super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
       _M_impl.super__Vector_impl_data._M_finish)))) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Self and references are exclusive. Only one of them can be specified");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  samplerTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ctx._baggage._M_h._M_buckets = &ctx._baggage._M_h._M_single_bucket;
  ctx.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_00297978;
  ctx._traceID._high = 0;
  ctx._traceID._low = 0;
  ctx._spanID = 0;
  ctx._parentID = 0;
  ctx._flags = '\0';
  ctx._baggage._M_h._M_bucket_count = 1;
  ctx._baggage._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ctx._baggage._M_h._M_element_count = 0;
  ctx._baggage._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ctx._baggage._M_h._M_rehash_policy._M_next_resize = 0;
  ctx._baggage._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ctx._debugID._M_dataplus._M_p = (pointer)&ctx._debugID.field_2;
  ctx._debugID._M_string_length = 0;
  samplerTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  samplerTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ctx._debugID.field_2._M_local_buf[0] = '\0';
  ctx._mutex.super___mutex_base._M_mutex.__align = 0;
  ctx._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  ctx._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  ctx._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  ctx._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  if ((result._parent == (SpanContext *)0x0) ||
     (bVar3 = SpanContext::isValid(result._parent), !bVar3)) {
    if (result._self == (SpanContext *)0x0) {
      if ((this_01->_options & 1) == 0) {
        traceID._high = 0;
      }
      else {
        traceID._high = randomID(this_01);
      }
      uVar4 = randomID(this_01);
      traceID._low = uVar4;
    }
    else {
      traceID._high = ((result._self)->_traceID)._high;
      uVar4 = (result._self)->_spanID;
      traceID._low = ((result._self)->_traceID)._low;
    }
    if ((result._parent == (SpanContext *)0x0) ||
       (bVar3 = SpanContext::isDebugIDContainerOnly(result._parent), !bVar3)) {
      peVar1 = (this_01->_sampler).
               super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      opentracing::v3::string_view::operator_cast_to_string
                ((string *)local_470,&operationName_local);
      (*peVar1->_vptr_Sampler[2])(&samplingStatus,peVar1,&traceID);
      std::__cxx11::string::~string((string *)local_470);
      uVar6 = samplingStatus._isSampled == true;
      if ((bool)uVar6) {
        std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::operator=
                  (&samplerTags,&samplingStatus._tags);
      }
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
                (&samplingStatus._tags);
    }
    else {
      std::__cxx11::string::string((string *)local_470,"jaeger-debug-id",(allocator *)local_498);
      Tag::Tag<std::__cxx11::string_const&>
                ((Tag *)&samplingStatus,(string *)local_470,&(result._parent)->_debugID);
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::
      emplace_back<jaegertracing::Tag>(&samplerTags,(Tag *)&samplingStatus);
      Tag::~Tag((Tag *)&samplingStatus);
      std::__cxx11::string::~string((string *)local_470);
      uVar6 = '\x03';
    }
    samplingStatus._0_8_ = auStack_420;
    samplingStatus._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
    samplingStatus._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    samplingStatus._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    auStack_420[0] = (__node_base_ptr)0x0;
    std::__cxx11::string::string((string *)local_470,"",(allocator *)local_498);
    SpanContext::SpanContext
              (&local_e0,&traceID,uVar4,0,uVar6,(StrMap *)&samplingStatus,(string *)local_470);
    SpanContext::swap(&ctx,&local_e0);
    SpanContext::~SpanContext(&local_e0);
    std::__cxx11::string::~string((string *)local_470);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&samplingStatus);
    bVar5 = 1;
    if (result._parent == (SpanContext *)0x0) goto LAB_001f34c4;
  }
  else {
    traceID._high = ((result._parent)->_traceID)._high;
    traceID._low = ((result._parent)->_traceID)._low;
    spanID = randomID(this_01);
    uVar4 = (result._parent)->_spanID;
    uVar6 = (result._parent)->_flags;
    samplingStatus._0_8_ = auStack_420;
    samplingStatus._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
    samplingStatus._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    samplingStatus._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    auStack_420[0] = (__node_base_ptr)0x0;
    std::__cxx11::string::string((string *)local_470,"",(allocator *)local_498);
    SpanContext::SpanContext
              (&local_190,&traceID,spanID,uVar4,uVar6,(StrMap *)&samplingStatus,(string *)local_470)
    ;
    SpanContext::swap(&ctx,&local_190);
    SpanContext::~SpanContext(&local_190);
    std::__cxx11::string::~string((string *)local_470);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&samplingStatus);
    bVar5 = 0;
  }
  if (((result._parent)->_baggage)._M_h._M_element_count != 0) {
    SpanContext::withBaggage(&local_240,&ctx,&(result._parent)->_baggage);
    SpanContext::swap(&ctx,&local_240);
    SpanContext::~SpanContext(&local_240);
  }
LAB_001f34c4:
  from_time_point_00.__d.__r = (duration)in_R8->__r;
  from_time_point.__d.__r = (duration)in_R8[1].__r;
  if (from_time_point_00.__d.__r == 0) {
    if (from_time_point.__d.__r == 0) {
      from_time_point_00.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      from_time_point.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      from_time_point_00.__d.__r =
           (duration)
           opentracing::v3::
           convert_time_point<std::chrono::_V2::system_clock,_std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_nullptr>
                     (from_time_point);
      from_time_point.__d.__r = (duration)in_R8[1].__r;
    }
  }
  else if (from_time_point.__d.__r == 0) {
    from_time_point.__d.__r =
         (duration)
         opentracing::v3::
         convert_time_point<std::chrono::_V2::steady_clock,_std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_nullptr>
                   (from_time_point_00);
    from_time_point_00.__d.__r = (duration)in_R8->__r;
  }
  traceID._high = (uint64_t)from_time_point.__d.__r;
  local_470[0]._0_8_ = from_time_point_00.__d.__r;
  opentracing::v3::string_view::operator_cast_to_string
            ((string *)&samplingStatus,&operationName_local);
  startSpanInternal((Tracer *)local_498,(SpanContext *)this_01,(string *)&ctx,
                    (time_point *)&samplingStatus,(time_point *)local_470,
                    (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)&traceID,
                    (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
                     *)&samplerTags,(bool)((char)in_R8 + '('),
                    (vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *)
                    (ulong)bVar5);
  uVar2 = local_498._8_8_;
  *(_func_int ***)local_498._8_8_ = (_func_int **)local_498._0_8_;
  local_498._0_8_ = (_func_int **)0x0;
  std::__cxx11::string::~string((string *)&samplingStatus);
  SpanContext::~SpanContext(&ctx);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&samplerTags);
  std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::~vector
            (&result._references);
  return (__uniq_ptr_data<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>,_true,_true>
          )(__uniq_ptr_data<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>,_true,_true>
            )uVar2;
}

Assistant:

std::unique_ptr<opentracing::Span>
Tracer::StartSpanWithOptions(string_view operationName,
                             const opentracing::StartSpanOptions& options) const
    noexcept
{
    try {
        const auto result = analyzeReferences(options.references);
        const auto* parent = result._parent;
        const auto* self = result._self;
        const auto& references = result._references;
        if (self && (parent || !references.empty()))
        {
            throw std::invalid_argument("Self and references are exclusive. Only one of them can be specified");
        }

        std::vector<Tag> samplerTags;
        auto newTrace = false;
        SpanContext ctx;
        if (!parent || !parent->isValid()) {
            newTrace = true;
            auto highID = static_cast<uint64_t>(0);
            auto lowID = static_cast<uint64_t>(0);
            if (self) {
                highID = self->traceID().high();
                lowID = self->traceID().low();
            }
            else {
                if (_options & kGen128BitOption) {
                    highID = randomID();
                }
                lowID = randomID();
            }
            const TraceID traceID(highID, lowID);
            const auto spanID = self ? self->spanID() : traceID.low();
            const auto parentID = 0;
            auto flags = static_cast<unsigned char>(0);
            if (parent && parent->isDebugIDContainerOnly()) {
                flags |=
                    (static_cast<unsigned char>(SpanContext::Flag::kSampled) |
                     static_cast<unsigned char>(SpanContext::Flag::kDebug));
                samplerTags.push_back(Tag(kJaegerDebugHeader, parent->debugID()));
            }
            else {
                const auto samplingStatus =
                    _sampler->isSampled(traceID, operationName);
                if (samplingStatus.isSampled()) {
                    flags |=
                        static_cast<unsigned char>(SpanContext::Flag::kSampled);
                    samplerTags = samplingStatus.tags();
                }
            }
            ctx = SpanContext(traceID, spanID, parentID, flags, StrMap());
        }
        else {
            const auto traceID = parent->traceID();
            const auto spanID = randomID();
            const auto parentID = parent->spanID();
            const auto flags = parent->flags();
            ctx = SpanContext(traceID, spanID, parentID, flags, StrMap());
        }

        if (parent && !parent->baggage().empty()) {
            ctx = ctx.withBaggage(parent->baggage());
        }

        SystemClock::time_point startTimeSystem;
        SteadyClock::time_point startTimeSteady;
        std::tie(startTimeSystem, startTimeSteady) =
            determineStartTimes(options);
        return startSpanInternal(ctx,
                                 operationName,
                                 startTimeSystem,
                                 startTimeSteady,
                                 samplerTags,
                                 options.tags,
                                 newTrace,
                                 references);
    } catch (const std::exception& ex) {
        std::ostringstream oss;
        oss << "Error occurred in Tracer::StartSpanWithOptions: " << ex.what();
        utils::ErrorUtil::logError(*_logger, oss.str());
        return nullptr;
    } catch (...) {
        utils::ErrorUtil::logError(
            *_logger, "Error occurred in Tracer::StartSpanWithOptions");
        return nullptr;
    }
}